

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi.cpp
# Opt level: O0

char * opn2_metaMusicCopyright(OPN2_MIDIPlayer *device)

{
  OPN2_MIDIPlayer *device_local;
  
  return (char *)0x0;
}

Assistant:

OPNMIDI_EXPORT const char *opn2_metaMusicCopyright(struct OPN2_MIDIPlayer *device)
{
#ifndef OPNMIDI_DISABLE_MIDI_SEQUENCER
    if(!device)
        return "";
    MidiPlayer *play = GET_MIDI_PLAYER(device);
    assert(play);
    return play->m_sequencer->getMusicCopyright().c_str();
#else
    ADL_UNUSED(device);
    return 0;
#endif
}